

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

bool __thiscall pbrt::IPCChannel::Send(IPCChannel *this,span<const_unsigned_char> message)

{
  ssize_t sVar1;
  string ret;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->socketFd != -1) || (Connect(this), this->socketFd != -1)) {
    *(int *)message.ptr = (int)message.n;
    sVar1 = send(this->socketFd,message.ptr,message.n,0);
    if ((long)(int)sVar1 == message.n) {
      return true;
    }
    if (LOGGING_LogLevel < 2) {
      LastError();
      ErrorString_abi_cxx11_(0);
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string>
                (&local_58,"send to display server failed: %s",&local_38);
      Log(Error,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/display.cpp"
          ,0xba,local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    Disconnect(this);
  }
  return false;
}

Assistant:

bool IPCChannel::Send(pstd::span<const uint8_t> message) {
    if (!Connected()) {
        Connect();
        if (!Connected())
            return false;
    }

    // Start with the length of the message.
    // FIXME: annoying coupling w/sending code's message buffer layout...
    int *startPtr = (int *)message.data();
    *startPtr = message.size();

    int bytesSent = send(socketFd, (const char *)message.data(), message.size(), 0 /* flags */);
    if (bytesSent == message.size())
        return true;

    LOG_ERROR("send to display server failed: %s", ErrorString());
    Disconnect();
    return false;
}